

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtcr(fitsfile *fptr,char *grpname,int grouptype,int *status)

{
  int iVar1;
  int local_38;
  int local_34;
  int hdunum;
  int hdutype;
  int *status_local;
  char *pcStack_20;
  int grouptype_local;
  char *grpname_local;
  fitsfile *fptr_local;
  
  if (*status == 0) {
    _hdunum = status;
    status_local._4_4_ = grouptype;
    pcStack_20 = grpname;
    grpname_local = (char *)fptr;
    iVar1 = ffthdu(fptr,&local_38,status);
    *_hdunum = iVar1;
    if (local_38 != 0) {
      iVar1 = ffmahd((fitsfile *)grpname_local,local_38,&local_34,_hdunum);
      *_hdunum = iVar1;
    }
    if (*_hdunum != 0) {
      *_hdunum = 0;
    }
    iVar1 = ffgtis((fitsfile *)grpname_local,pcStack_20,status_local._4_4_,_hdunum);
    *_hdunum = iVar1;
    fptr_local._4_4_ = *_hdunum;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgtcr(fitsfile *fptr,      /* FITS file pointer                         */
	   char    *grpname,    /* name of the grouping table                */
	   int      grouptype,  /* code specifying the type of
				   grouping table information:
				   GT_ID_ALL_URI  0 ==> defualt (all columns)
				   GT_ID_REF      1 ==> ID by reference
				   GT_ID_POS      2 ==> ID by position
				   GT_ID_ALL      3 ==> ID by ref. and position
				   GT_ID_REF_URI 11 ==> (1) + URI info 
				   GT_ID_POS_URI 12 ==> (2) + URI info       */
	   int      *status    )/* return status code                        */

/* 
   create a grouping table at the end of the current FITS file. This
   function makes the last HDU in the file the CHDU, then calls the
   fits_insert_group() function to actually create the new grouping table.
*/

{
  int hdutype;
  int hdunum;


  if(*status != 0) return(*status);


  *status = fits_get_num_hdus(fptr,&hdunum,status);

  /* If hdunum is 0 then we are at the beginning of the file and
     we actually haven't closed the first header yet, so don't do
     anything more */

  if (0 != hdunum) {

      *status = fits_movabs_hdu(fptr,hdunum,&hdutype,status);
  }

  /* Now, the whole point of the above two fits_ calls was to get to
     the end of file.  Let's ignore errors at this point and keep
     going since any error is likely to mean that we are already at the 
     EOF, or the file is fatally corrupted.  If we are at the EOF then
     the next fits_ call will be ok.  If it's corrupted then the
     next call will fail, but that's not big deal at this point.
  */

  if (0 != *status ) *status = 0;

  *status = fits_insert_group(fptr,grpname,grouptype,status);

  return(*status);
}